

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Electrostatic.cpp
# Opt level: O2

void __thiscall
OpenMD::Electrostatic::getSitePotentials
          (Electrostatic *this,Atom *a1,Atom *a2,bool excluded,RealType *spot1,RealType *spot2)

{
  Vector3d *v1;
  AtomType *this_00;
  ulong uVar1;
  Atom *this_01;
  int iVar2;
  int iVar3;
  undefined4 uVar4;
  ulong uVar5;
  RealType RVar6;
  double dVar7;
  RealType rij;
  Vector3d d;
  double local_158;
  Atom *local_150;
  double local_148;
  RealType *local_140;
  double local_138;
  RealType *local_130;
  RectMatrix<double,_3U,_3U> local_128;
  RectMatrix<double,_3U,_3U> local_e0;
  RectMatrix<double,_3U,_3U> local_98;
  Vector<double,_3U> local_50;
  
  local_140 = spot1;
  local_130 = spot2;
  if (this->initialized_ == false) {
    initialize(this);
  }
  this_00 = a2->atomType_;
  iVar2 = AtomType::getIdent(a1->atomType_);
  iVar3 = AtomType::getIdent(this_00);
  ElectrostaticAtomData::operator=
            (&this->data1,
             (this->ElectrostaticMap).
             super__Vector_base<OpenMD::ElectrostaticAtomData,_std::allocator<OpenMD::ElectrostaticAtomData>_>
             ._M_impl.super__Vector_impl_data._M_start +
             (this->Etids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[iVar2]);
  ElectrostaticAtomData::operator=
            (&this->data2,
             (this->ElectrostaticMap).
             super__Vector_base<OpenMD::ElectrostaticAtomData,_std::allocator<OpenMD::ElectrostaticAtomData>_>
             ._M_impl.super__Vector_impl_data._M_start +
             (this->Etids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[iVar3]);
  this->Pa = 0.0;
  this->Pb = 0.0;
  local_150 = a2;
  StuntDouble::getPos((Vector3d *)&local_e0,&a2->super_StuntDouble);
  StuntDouble::getPos((Vector3d *)&local_98,&a1->super_StuntDouble);
  operator-((Vector<double,_3U> *)&local_128,(Vector<double,_3U> *)&local_e0,
            (Vector<double,_3U> *)&local_98);
  Vector<double,_3U>::Vector(&local_50,(Vector<double,_3U> *)&local_128);
  Snapshot::wrapVector(this->info_->sman_->currentSnapshot_,(Vector3d *)&local_50);
  local_158 = Vector<double,_3U>::length(&local_50);
  local_148 = 1.0 / local_158;
  local_138 = local_158;
  operator*((Vector<double,_3U> *)&local_128,&local_50,local_148);
  v1 = &this->rhat;
  Vector3<double>::operator=(v1,(Vector<double,_3U> *)&local_128);
  if (local_138 < this->cutoffRadius_ && !excluded) {
    uVar5._0_1_ = (this->data1).is_Charge;
    uVar5._1_1_ = (this->data1).is_Dipole;
    uVar5._2_1_ = (this->data1).is_Quadrupole;
    uVar5._3_1_ = (this->data1).is_Fluctuating;
    uVar5._4_1_ = (this->data1).uses_SlaterIntramolecular;
    uVar5._5_3_ = *(undefined3 *)&(this->data1).field_0x5;
    uVar1._0_1_ = (this->data2).is_Charge;
    uVar1._1_1_ = (this->data2).is_Dipole;
    uVar1._2_1_ = (this->data2).is_Quadrupole;
    uVar1._3_1_ = (this->data2).is_Fluctuating;
    uVar1._4_1_ = (this->data2).uses_SlaterIntramolecular;
    uVar1._5_3_ = *(undefined3 *)&(this->data2).field_0x5;
    uVar4 = (undefined4)uVar5;
    this->a_is_Charge = (bool)(char)uVar4;
    this->a_is_Dipole = (bool)(char)((uint)uVar4 >> 8);
    this->a_is_Quadrupole = (bool)(char)((uint)uVar4 >> 0x10);
    this->a_is_Fluctuating = (bool)(char)((uint)uVar4 >> 0x18);
    uVar4 = (undefined4)uVar1;
    this->b_is_Charge = (bool)(char)uVar4;
    this->b_is_Dipole = (bool)(char)((uint)uVar4 >> 8);
    this->b_is_Quadrupole = (bool)(char)((uint)uVar4 >> 0x10);
    this->b_is_Fluctuating = (bool)(char)((uint)uVar4 >> 0x18);
    if (((uVar5 & 1) == 0) && ((uVar1 & 1) == 0)) {
      uVar5 = uVar5 >> 8 & 0xffffff;
    }
    else {
      RVar6 = CubicSpline::getValueAt
                        ((this->v01s).
                         super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         &local_158);
      this->v01 = RVar6;
      uVar5 = (ulong)this->a_is_Dipole;
    }
    this_01 = local_150;
    if (((uVar5 & 1) != 0) || (this->b_is_Dipole == true)) {
      RVar6 = CubicSpline::getValueAt
                        ((this->v11s).
                         super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         &local_158);
      this->v11 = RVar6;
      this->v11or = RVar6 * local_148;
    }
    if ((this->a_is_Quadrupole != false) || (this->b_is_Quadrupole == true)) {
      RVar6 = CubicSpline::getValueAt
                        ((this->v21s).
                         super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         &local_158);
      this->v21 = RVar6;
      RVar6 = CubicSpline::getValueAt
                        ((this->v22s).
                         super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         &local_158);
      this->v22 = RVar6;
      this->v22or = local_148 * RVar6;
    }
    if (this->a_is_Charge == true) {
      dVar7 = (this->data1).fixedCharge;
      this->C_a = dVar7;
      if (this->a_is_Fluctuating == true) {
        dVar7 = dVar7 + *(double *)
                         (*(long *)((long)&(((a1->super_StuntDouble).snapshotMan_)->currentSnapshot_
                                           ->atomData).flucQPos.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_start +
                                   (a1->super_StuntDouble).storage_) +
                         (long)(a1->super_StuntDouble).localIndex_ * 8);
        this->C_a = dVar7;
      }
      this->Pb = dVar7 * this->pre11_ * this->v01 + this->Pb;
    }
    if (this->a_is_Dipole == true) {
      StuntDouble::getDipole((Vector3d *)&local_e0,&a1->super_StuntDouble);
      operator*((Vector<double,_3U> *)&local_128,(Vector<double,_3U> *)&local_e0,0.20819434);
      Vector3<double>::operator=(&this->D_a,(Vector<double,_3U> *)&local_128);
      dVar7 = dot<double,3u>(&v1->super_Vector<double,_3U>,&(this->D_a).super_Vector<double,_3U>);
      this->rdDa = dVar7;
      this->Pb = this->pre12_ * this->v11 * dVar7 + this->Pb;
    }
    if (this->a_is_Quadrupole == true) {
      StuntDouble::getQuadrupole((Mat3x3d *)&local_98,&a1->super_StuntDouble);
      operator*(&local_e0,&local_98,0.20819434);
      RectMatrix<double,_3U,_3U>::operator=(&local_128,&local_e0);
      SquareMatrix3<double>::operator=(&this->Q_a,(SquareMatrix<double,_3> *)&local_128);
      this->trQa = (this->Q_a).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                   [0][0] + (this->Q_a).super_SquareMatrix<double,_3>.
                            super_RectMatrix<double,_3U,_3U>.data_[1][1] +
                   (this->Q_a).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                   [2][2];
      operator*((Vector<double,_3U> *)&local_128,(RectMatrix<double,_3U,_3U> *)&this->Q_a,
                &v1->super_Vector<double,_3U>);
      Vector3<double>::operator=(&this->Qar,(Vector<double,_3U> *)&local_128);
      dVar7 = dot<double,3u>(&v1->super_Vector<double,_3U>,&(this->Qar).super_Vector<double,_3U>);
      this->rdQar = dVar7;
      this->Pb = (this->v21 * this->trQa + dVar7 * this->v22) * this->pre14_ + this->Pb;
    }
    if (this->b_is_Charge == true) {
      dVar7 = (this->data2).fixedCharge;
      this->C_b = dVar7;
      if (this->b_is_Fluctuating == true) {
        dVar7 = dVar7 + *(double *)
                         (*(long *)((long)&(((this_01->super_StuntDouble).snapshotMan_)->
                                            currentSnapshot_->atomData).flucQPos.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_start +
                                   (this_01->super_StuntDouble).storage_) +
                         (long)(this_01->super_StuntDouble).localIndex_ * 8);
        this->C_b = dVar7;
      }
      this->Pa = dVar7 * this->pre11_ * this->v01 + this->Pa;
    }
    if (this->b_is_Dipole == true) {
      StuntDouble::getDipole((Vector3d *)&local_e0,&this_01->super_StuntDouble);
      operator*((Vector<double,_3U> *)&local_128,(Vector<double,_3U> *)&local_e0,0.20819434);
      Vector3<double>::operator=(&this->D_b,(Vector<double,_3U> *)&local_128);
      dVar7 = dot<double,3u>(&v1->super_Vector<double,_3U>,&(this->D_b).super_Vector<double,_3U>);
      this->rdDb = dVar7;
      this->Pa = this->pre12_ * this->v11 * dVar7 + this->Pa;
    }
    if (this->b_is_Quadrupole == false) {
      RVar6 = this->Pa;
    }
    else {
      StuntDouble::getQuadrupole((Mat3x3d *)&local_98,&this_01->super_StuntDouble);
      operator*(&local_e0,&local_98,0.20819434);
      RectMatrix<double,_3U,_3U>::operator=(&local_128,&local_e0);
      SquareMatrix3<double>::operator=(&this->Q_a,(SquareMatrix<double,_3> *)&local_128);
      this->trQb = (this->Q_b).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                   [0][0] + (this->Q_b).super_SquareMatrix<double,_3>.
                            super_RectMatrix<double,_3U,_3U>.data_[1][1] +
                   (this->Q_b).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                   [2][2];
      operator*((Vector<double,_3U> *)&local_128,(RectMatrix<double,_3U,_3U> *)&this->Q_b,
                &v1->super_Vector<double,_3U>);
      Vector3<double>::operator=(&this->Qbr,(Vector<double,_3U> *)&local_128);
      dVar7 = dot<double,3u>(&v1->super_Vector<double,_3U>,&(this->Qbr).super_Vector<double,_3U>);
      this->rdQbr = dVar7;
      RVar6 = (this->v21 * this->trQb + dVar7 * this->v22) * this->pre14_ + this->Pa;
      this->Pa = RVar6;
    }
    *local_140 = RVar6;
    RVar6 = this->Pb;
  }
  else {
    *local_140 = 0.0;
    RVar6 = 0.0;
  }
  *local_130 = RVar6;
  return;
}

Assistant:

void Electrostatic::getSitePotentials(Atom* a1, Atom* a2, bool excluded,
                                        RealType& spot1, RealType& spot2) {
    if (!initialized_) { initialize(); }

    const RealType mPoleConverter = 0.20819434;

    AtomType* atype1 = a1->getAtomType();
    AtomType* atype2 = a2->getAtomType();
    int atid1        = atype1->getIdent();
    int atid2        = atype2->getIdent();
    data1            = ElectrostaticMap[Etids[atid1]];
    data2            = ElectrostaticMap[Etids[atid2]];

    Pa = 0.0;  // Site potential at site a
    Pb = 0.0;  // Site potential at site b

    Vector3d d = a2->getPos() - a1->getPos();
    info_->getSnapshotManager()->getCurrentSnapshot()->wrapVector(d);
    RealType rij = d.length();
    // some variables we'll need independent of electrostatic type:

    RealType ri = 1.0 / rij;
    rhat        = d * ri;

    if ((rij >= cutoffRadius_) || excluded) {
      spot1 = 0.0;
      spot2 = 0.0;
      return;
    }

    // logicals

    a_is_Charge      = data1.is_Charge;
    a_is_Dipole      = data1.is_Dipole;
    a_is_Quadrupole  = data1.is_Quadrupole;
    a_is_Fluctuating = data1.is_Fluctuating;

    b_is_Charge      = data2.is_Charge;
    b_is_Dipole      = data2.is_Dipole;
    b_is_Quadrupole  = data2.is_Quadrupole;
    b_is_Fluctuating = data2.is_Fluctuating;

    // Obtain all of the required radial function values from the
    // spline structures:

    if (a_is_Charge || b_is_Charge) { v01 = v01s->getValueAt(rij); }
    if (a_is_Dipole || b_is_Dipole) {
      v11   = v11s->getValueAt(rij);
      v11or = ri * v11;
    }
    if (a_is_Quadrupole || b_is_Quadrupole) {
      v21   = v21s->getValueAt(rij);
      v22   = v22s->getValueAt(rij);
      v22or = ri * v22;
    }

    if (a_is_Charge) {
      C_a = data1.fixedCharge;

      if (a_is_Fluctuating) { C_a += a1->getFlucQPos(); }

      Pb += C_a * pre11_ * v01;
    }

    if (a_is_Dipole) {
      D_a  = a1->getDipole() * mPoleConverter;
      rdDa = dot(rhat, D_a);
      Pb += pre12_ * v11 * rdDa;
    }

    if (a_is_Quadrupole) {
      Q_a   = a1->getQuadrupole() * mPoleConverter;
      trQa  = Q_a.trace();
      Qar   = Q_a * rhat;
      rdQar = dot(rhat, Qar);
      Pb += pre14_ * (v21 * trQa + v22 * rdQar);
    }

    if (b_is_Charge) {
      C_b = data2.fixedCharge;

      if (b_is_Fluctuating) C_b += a2->getFlucQPos();

      Pa += C_b * pre11_ * v01;
    }

    if (b_is_Dipole) {
      D_b  = a2->getDipole() * mPoleConverter;
      rdDb = dot(rhat, D_b);
      Pa += pre12_ * v11 * rdDb;
    }

    if (b_is_Quadrupole) {
      Q_a   = a2->getQuadrupole() * mPoleConverter;
      trQb  = Q_b.trace();
      Qbr   = Q_b * rhat;
      rdQbr = dot(rhat, Qbr);
      Pa += pre14_ * (v21 * trQb + v22 * rdQbr);
    }

    spot1 = Pa;
    spot2 = Pb;
  }